

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_finish_decode
               (uchar *cbuffer,size_t cbufsize,uint w,uint h,LodePNGState *state,void *idat_in,
               size_t idatsize_in)

{
  LodePNGColorMode *dest;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  uchar *tbuf;
  LodePNGColorMode *local_38;
  
  if (cbuffer == (uchar *)0x0 || cbufsize == 0) {
    state->error = 0x69;
    uVar2 = 0x69;
  }
  else {
    dest = &state->info_raw;
    local_38 = &(state->info_png).color;
    if ((state->decoder).color_convert == 0) {
      uVar2 = lodepng_color_mode_copy(dest,local_38);
      state->error = uVar2;
      if (uVar2 != 0) {
        return uVar2;
      }
    }
    else {
      iVar1 = lodepng_color_mode_equal(dest,local_38);
      if (iVar1 == 0) {
        uVar2 = inflateIdat(&tbuf,(uchar *)0x0,0,w,h,state,idat_in,idatsize_in);
        state->error = uVar2;
        if ((((state->info_raw).colortype | LCT_GREY_ALPHA) != LCT_RGBA) &&
           ((state->info_raw).bitdepth != 8)) {
          return 0x38;
        }
        sVar3 = lodepng_get_raw_size(w,h,dest);
        if (cbufsize < sVar3) {
          state->error = 0x7b;
          return 0x7b;
        }
        uVar2 = lodepng_convert(cbuffer,tbuf,dest,local_38,w,h);
        state->error = uVar2;
        free(tbuf);
        return state->error;
      }
    }
    uVar2 = inflateIdat((uchar **)0x0,cbuffer,cbufsize,w,h,state,idat_in,idatsize_in);
    state->error = uVar2;
  }
  return uVar2;
}

Assistant:

unsigned lodepng_finish_decode(unsigned char* cbuffer, size_t cbufsize,
                               unsigned w, unsigned h,
                               LodePNGState* state, void* idat_in, size_t idatsize_in)
{
  if (!cbuffer || cbufsize == 0)
      CERROR_RETURN_ERROR(state->error, 105);  /*no destination specified*/

  if(!state->decoder.color_convert || lodepng_color_mode_equal(&state->info_raw, &state->info_png.color)) {
    /*same color type, no copying or converting of data needed*/
    /*store the info_png color settings on the info_raw so that the info_raw still reflects what colortype
    the raw image has to the end user*/
    if(!state->decoder.color_convert) {
      state->error = lodepng_color_mode_copy(&state->info_raw, &state->info_png.color);
      if(state->error) return state->error;
    }
    state->error = inflateIdat(NULL, cbuffer, cbufsize, w, h, state, idat_in, idatsize_in);
  } else {
    size_t outsize;
    unsigned char* tbuf;

    /*color conversion needed. Have lodepng_inflate_idat create a temporary buffer for the unconverted data*/
    state->error = inflateIdat(&tbuf, NULL, 0, w, h, state, idat_in, idatsize_in);
    if(!(state->info_raw.colortype == LCT_RGB || state->info_raw.colortype == LCT_RGBA)
      && !(state->info_raw.bitdepth == 8)) {
      return 56; /*unsupported color mode conversion*/
    }
    outsize = lodepng_get_raw_size(w, h, &state->info_raw);
    if(cbufsize < outsize) CERROR_RETURN_ERROR(state->error, 123); /* error: "destination buffer too small */
    state->error = lodepng_convert(cbuffer, tbuf, &state->info_raw,
                                   &state->info_png.color, w, h);
    lodepng_free(tbuf);
  }
  return state->error;
}